

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O3

void printU4ImmOperand(MCInst *MI,int OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  ulong uVar3;
  ulong uVar4;
  char *fmt;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar3 = MCOperand_getImm(op);
  if ((long)uVar3 < 0) {
    uVar4 = -uVar3;
    if (uVar3 < 0xfffffffffffffff7) {
      fmt = "-0x%lx";
    }
    else {
      fmt = "-%lu";
    }
  }
  else {
    uVar4 = uVar3;
    if (uVar3 < 10) {
      fmt = "%lu";
    }
    else {
      fmt = "0x%lx";
    }
  }
  SStream_concat(O,fmt,uVar4);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x16;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(ulong *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[0] * 0x20 + 0x1e) = uVar3;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printU4ImmOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	unsigned int Value = (int)MCOperand_getImm(MCInst_getOperand(MI, OpNo));
	//assert(Value <= 15 && "Invalid u4imm argument!");

	if (Value > HEX_THRESHOLD)
		SStream_concat(O, "0x%x", Value);
	else
		SStream_concat(O, "%u", Value);

	if (MI->csh->detail) {
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = Value;
		MI->flat_insn->detail->ppc.op_count++;
	}
}